

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

RaviArray * raviH_new_number_array(lua_State *L,uint len,lua_Number init_value)

{
  char *pcVar1;
  uint new_size;
  int iVar2;
  RaviArray *t_00;
  uint local_3c;
  uint i;
  lua_Number *data;
  uint new_len;
  RaviArray *t;
  lua_Number init_value_local;
  uint len_local;
  lua_State *L_local;
  
  t_00 = raviH_new(L,0x40,0);
  new_size = len + 1;
  if (new_size < len) {
    luaG_runerror(L,"array length out of range");
  }
  iVar2 = ravi_resize_array(L,t_00,new_size,0);
  if (iVar2 == 0) {
    luaG_runerror(L,"array length out of range");
  }
  pcVar1 = t_00->data;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  for (local_3c = 1; local_3c < new_size; local_3c = local_3c + 1) {
    *(lua_Number *)(pcVar1 + (ulong)local_3c * 8) = init_value;
  }
  t_00->len = new_size;
  t_00->flags = t_00->flags | 2;
  return t_00;
}

Assistant:

RaviArray *raviH_new_number_array(lua_State *L, unsigned int len,
                              lua_Number init_value) {
  RaviArray *t = raviH_new(L, RAVI_TM_FLOAT_ARRAY, 0);
  unsigned int new_len = len + 1; // Ravi arrays have an extra slot at offset 0
  if (new_len < len) { // Wrapped?
    luaG_runerror(L, "array length out of range");
  }
  if (!ravi_resize_array(L, t, new_len, 0)) {
    luaG_runerror(L, "array length out of range");
  }
  lua_Number *data = (lua_Number *)t->data;
  data[0] = 0;
  for (unsigned int i = 1; i < new_len; i++) {
    data[i] = init_value;
  }
  t->len = new_len;
  t->flags |= RAVI_ARRAY_FIXEDSIZE;
  return t;
}